

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void vera::setWindowIcon(uchar *_data,size_t _width,size_t _height)

{
  GLFWimage image;
  
  image.width = (int)_width;
  image.height = (int)_height;
  image.pixels = _data;
  glfwSetWindowIcon(window,1,&image);
  return;
}

Assistant:

void setWindowIcon(unsigned char* _data, size_t _width, size_t _height) {
#if defined(DRIVER_GLFW)
    GLFWimage image;
    image.pixels = _data;
    image.width = _width;
    image.height = _height;
    glfwSetWindowIcon(window, 1, &image);
#endif
}